

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_closure.cpp
# Opt level: O0

void icu_63::addCaseMapping(UnicodeSet *set,int32_t result,UChar *full,UnicodeString *str)

{
  ConstChar16Ptr local_30;
  UnicodeString *local_28;
  UnicodeString *str_local;
  UChar *full_local;
  UnicodeSet *pUStack_10;
  int32_t result_local;
  UnicodeSet *set_local;
  
  if (-1 < result) {
    local_28 = str;
    str_local = (UnicodeString *)full;
    full_local._4_4_ = result;
    pUStack_10 = set;
    if (result < 0x20) {
      ConstChar16Ptr::ConstChar16Ptr(&local_30,full);
      UnicodeString::setTo(str,'\0',&local_30,full_local._4_4_);
      ConstChar16Ptr::~ConstChar16Ptr(&local_30);
      UnicodeSet::add(pUStack_10,local_28);
    }
    else {
      UnicodeSet::add(set,result);
    }
  }
  return;
}

Assistant:

static inline void
addCaseMapping(UnicodeSet &set, int32_t result, const UChar *full, UnicodeString &str) {
    if(result >= 0) {
        if(result > UCASE_MAX_STRING_LENGTH) {
            // add a single-code point case mapping
            set.add(result);
        } else {
            // add a string case mapping from full with length result
            str.setTo((UBool)FALSE, full, result);
            set.add(str);
        }
    }
    // result < 0: the code point mapped to itself, no need to add it
    // see ucase.h
}